

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

World * __thiscall
MyPlanner::InitializeWorld(MyPlanner *this,string *world_type,DSPOMDP *model,Option *options)

{
  char *__s;
  Option *pOVar1;
  POMDPX *pPVar2;
  Option *local_b0;
  Option *local_98;
  allocator<char> local_59;
  string local_58 [32];
  Option *local_38;
  DSPOMDP *world;
  Option *options_local;
  DSPOMDP *model_local;
  string *world_type_local;
  MyPlanner *this_local;
  
  world = (DSPOMDP *)options;
  options_local = (Option *)model;
  model_local = (DSPOMDP *)world_type;
  world_type_local = (string *)this;
  pOVar1 = despot::option::Option::operator_cast_to_Option_(options + 0x90);
  if (pOVar1 == (Option *)0x0) {
    this_local = (MyPlanner *)
                 despot::PlannerBase::InitializePOMDPWorld((string *)this,model_local,options_local)
    ;
  }
  else {
    pPVar2 = (POMDPX *)operator_new(0x118);
    __s = *(char **)(world + 0xb0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_58,__s,&local_59);
    despot::POMDPX::POMDPX(pPVar2,local_58);
    local_98 = (Option *)0x0;
    if (pPVar2 != (POMDPX *)0x0) {
      local_98 = (Option *)(pPVar2 + 0x38);
    }
    std::__cxx11::string::~string(local_58);
    std::allocator<char>::~allocator(&local_59);
    local_38 = local_98;
    if (local_98 == (Option *)0x0) {
      local_b0 = (Option *)0x0;
    }
    else {
      local_b0 = local_98 + -0x38;
    }
    despot::POMDPX::current_ = local_b0;
    this_local = (MyPlanner *)
                 despot::PlannerBase::InitializePOMDPWorld((string *)this,model_local,local_98);
  }
  return (World *)this_local;
}

Assistant:

World* InitializeWorld(std::string&  world_type, DSPOMDP* model, option::Option* options)
  {
		if (options[E_WORLD_FILE]) { // ignore the provided model
			DSPOMDP* world = new POMDPX(options[E_WORLD_FILE].arg);
			POMDPX::current_ = (POMDPX*) world;

			return InitializePOMDPWorld(world_type, world, options);
		} else {
			return InitializePOMDPWorld(world_type, model, options);
		}
  }